

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O0

VkResult shim_vkGetPhysicalDeviceSurfaceSupportKHR
                   (VkPhysicalDevice physicalDevice,uint32_t queueFamilyIndex,VkSurfaceKHR surface,
                   VkBool32 *pSupported)

{
  size_type sVar1;
  reference ppVVar2;
  reference pvVar3;
  ulong local_38;
  size_t i;
  VkBool32 *pSupported_local;
  VkSurfaceKHR surface_local;
  uint32_t queueFamilyIndex_local;
  VkPhysicalDevice physicalDevice_local;
  
  local_38 = 0;
  do {
    sVar1 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::size
                      (&mock.physical_device_handles);
    if (sVar1 <= local_38) {
      if ((surface != (VkSurfaceKHR)0x0) && (pSupported != (VkBool32 *)0x0)) {
        *pSupported = 1;
      }
      return VK_SUCCESS;
    }
    ppVVar2 = std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::operator[]
                        (&mock.physical_device_handles,local_38);
    if (physicalDevice == *ppVVar2) {
      pvVar3 = std::
               vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
               ::operator[](&mock.physical_devices_details,local_38);
      sVar1 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::size
                        (&pvVar3->queue_family_properties);
      if (sVar1 <= queueFamilyIndex) {
        return VK_ERROR_FORMAT_NOT_SUPPORTED;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

VKAPI_ATTR VkResult VKAPI_CALL shim_vkGetPhysicalDeviceSurfaceSupportKHR(
    VkPhysicalDevice physicalDevice, uint32_t queueFamilyIndex, VkSurfaceKHR surface, VkBool32* pSupported) {

    for (size_t i = 0; i < mock.physical_device_handles.size(); i++) {
        if (physicalDevice == mock.physical_device_handles[i]) {
            if (queueFamilyIndex >= mock.physical_devices_details[i].queue_family_properties.size()) {
                return VK_ERROR_FORMAT_NOT_SUPPORTED;
            }
        }
    }
    if (surface && pSupported) {
        *pSupported = true;
    }
    return VK_SUCCESS;
}